

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_Sum(SumForm1 Sum,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  undefined4 in_EDX;
  code *in_RDI;
  uint32_t i;
  TimerContainer timer;
  Image image;
  Image *in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff3c;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff40;
  uint local_ac;
  BaseTimerContainer *in_stack_ffffffffffffff90;
  undefined1 local_50 [56];
  code *local_18;
  pair<double,_double> local_10;
  
  local_18 = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_EDX,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
             (uint8_t)((ulong)in_stack_ffffffffffffff30 >> 0x38),
             (uint8_t)((ulong)in_stack_ffffffffffffff30 >> 0x30));
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x174dc9);
  SetupFunction((string *)0x174dd6);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)in_stack_ffffffffffffff30);
  local_ac = 0;
  while( true ) {
    uVar2 = local_ac;
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)in_stack_ffffffffffffff30);
    (*local_18)(local_50);
    Performance_Test::TimerContainer::stop((TimerContainer *)CONCAT44(in_EDX,uVar1));
    local_ac = local_ac + 1;
  }
  CleanupFunction((string *)0x174ea1);
  local_10 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff90);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x174ee1);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x174eee);
  return local_10;
}

Assistant:

std::pair < double, double > template_Sum( SumForm1 Sum, const std::string & namespaceName, uint32_t size )
    {
        PenguinV_Image::Image image = Performance_Test::uniformImage( size, size );

        TEST_FUNCTION_LOOP( Sum( image ), namespaceName )
    }